

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::data__common_float_or_param_type____float
          (LibraryEffectsLoader *this,float value)

{
  FloatOrParam local_b0;
  
  local_b0.mFloatValue = value;
  switch(this->mCurrentShaderParameterType) {
  case SHADER_PARAMETER_SHININESS:
    local_b0.mParam.mName._M_dataplus._M_p = (pointer)&local_b0.mParam.mName.field_2;
    local_b0.super_Animatable.mAnimationList.mClassId = NO_TYPE;
    local_b0.super_Animatable.mAnimationList.mObjectId = 0;
    local_b0.super_Animatable.mAnimationList.mFileId = 0;
    local_b0.super_Animatable._vptr_Animatable = (_func_int **)&PTR__FloatOrParam_00934910;
    local_b0.mType = FLOAT;
    local_b0.mParam._vptr_Param = (_func_int **)&PTR__Param_00934948;
    local_b0.mParam.mName._M_string_length = 0;
    local_b0.mParam.mName.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mSid._M_dataplus._M_p = (pointer)&local_b0.mParam.mSid.field_2;
    local_b0.mParam.mSid._M_string_length = 0;
    local_b0.mParam.mSid.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mType = VALUE_TYPE_UNSPECIFIED;
    local_b0.mParam.mSemantic._M_dataplus._M_p = (pointer)&local_b0.mParam.mSemantic.field_2;
    local_b0.mParam.mSemantic._M_string_length = 0;
    local_b0.mParam.mSemantic.field_2._M_local_buf[0] = '\0';
    COLLADAFW::EffectCommon::setShininess
              ((this->mCurrentEffect->mCommonEffects).
               super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
               [(this->mCurrentEffect->mCommonEffects).
                super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1],&local_b0);
    break;
  default:
    goto switchD_007bf0d8_caseD_5;
  case SHADER_PARAMETER_REFLECTIVITY:
    local_b0.mParam.mName._M_dataplus._M_p = (pointer)&local_b0.mParam.mName.field_2;
    local_b0.super_Animatable.mAnimationList.mClassId = NO_TYPE;
    local_b0.super_Animatable.mAnimationList.mObjectId = 0;
    local_b0.super_Animatable.mAnimationList.mFileId = 0;
    local_b0.super_Animatable._vptr_Animatable = (_func_int **)&PTR__FloatOrParam_00934910;
    local_b0.mType = FLOAT;
    local_b0.mParam._vptr_Param = (_func_int **)&PTR__Param_00934948;
    local_b0.mParam.mName._M_string_length = 0;
    local_b0.mParam.mName.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mSid._M_dataplus._M_p = (pointer)&local_b0.mParam.mSid.field_2;
    local_b0.mParam.mSid._M_string_length = 0;
    local_b0.mParam.mSid.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mType = VALUE_TYPE_UNSPECIFIED;
    local_b0.mParam.mSemantic._M_dataplus._M_p = (pointer)&local_b0.mParam.mSemantic.field_2;
    local_b0.mParam.mSemantic._M_string_length = 0;
    local_b0.mParam.mSemantic.field_2._M_local_buf[0] = '\0';
    COLLADAFW::EffectCommon::setReflectivity
              ((this->mCurrentEffect->mCommonEffects).
               super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
               [(this->mCurrentEffect->mCommonEffects).
                super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1],&local_b0);
    break;
  case SHADER_PARAMETER_TRANSPARENCY:
    (this->mTransparency).mFloatValue = value;
    return true;
  case SHADER_PARAMETER_INDEX_OF_REFRACTION:
    local_b0.mParam.mName._M_dataplus._M_p = (pointer)&local_b0.mParam.mName.field_2;
    local_b0.super_Animatable.mAnimationList.mClassId = NO_TYPE;
    local_b0.super_Animatable.mAnimationList.mObjectId = 0;
    local_b0.super_Animatable.mAnimationList.mFileId = 0;
    local_b0.super_Animatable._vptr_Animatable = (_func_int **)&PTR__FloatOrParam_00934910;
    local_b0.mType = FLOAT;
    local_b0.mParam._vptr_Param = (_func_int **)&PTR__Param_00934948;
    local_b0.mParam.mName._M_string_length = 0;
    local_b0.mParam.mName.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mSid._M_dataplus._M_p = (pointer)&local_b0.mParam.mSid.field_2;
    local_b0.mParam.mSid._M_string_length = 0;
    local_b0.mParam.mSid.field_2._M_local_buf[0] = '\0';
    local_b0.mParam.mType = VALUE_TYPE_UNSPECIFIED;
    local_b0.mParam.mSemantic._M_dataplus._M_p = (pointer)&local_b0.mParam.mSemantic.field_2;
    local_b0.mParam.mSemantic._M_string_length = 0;
    local_b0.mParam.mSemantic.field_2._M_local_buf[0] = '\0';
    COLLADAFW::EffectCommon::setIndexOfRefraction
              ((this->mCurrentEffect->mCommonEffects).
               super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData
               [(this->mCurrentEffect->mCommonEffects).
                super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount - 1],&local_b0);
  }
  local_b0.super_Animatable._vptr_Animatable = (_func_int **)&PTR__FloatOrParam_00934910;
  COLLADAFW::Param::~Param(&local_b0.mParam);
  local_b0.super_Animatable._vptr_Animatable = (_func_int **)&PTR__Animatable_009348f0;
  COLLADAFW::UniqueId::~UniqueId(&local_b0.super_Animatable.mAnimationList);
switchD_007bf0d8_caseD_5:
  return true;
}

Assistant:

bool LibraryEffectsLoader::data__common_float_or_param_type____float( float value )
	{
		switch ( mCurrentShaderParameterType)
		{
		case SHADER_PARAMETER_SHININESS:
			mCurrentEffect->getCommonEffects().back()->setShininess(value);
			break;
		case SHADER_PARAMETER_REFLECTIVITY:
			mCurrentEffect->getCommonEffects().back()->setReflectivity(value);
			break;
		case SHADER_PARAMETER_INDEX_OF_REFRACTION:
			mCurrentEffect->getCommonEffects().back()->setIndexOfRefraction(value);
			break;
		case SHADER_PARAMETER_TRANSPARENCY:
			mTransparency.setFloatValue (value);
			break;
        default:
            break;
		}
        
		return true;
	}